

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ObjMergeOrder(Nf_Man_t *p,int iObj)

{
  int *pCut;
  long lVar1;
  uint nCutNum;
  undefined8 uVar2;
  undefined8 uVar3;
  Nf_Cut_t *pCut_00;
  Vec_Mem_t *pVVar4;
  Vec_Wec_t *p_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int Count;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint nCuts;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Gia_Obj_t *pObj;
  ulong uVar16;
  Gia_Obj_t *pGVar17;
  long lVar18;
  word *pwVar19;
  word wVar20;
  word wVar21;
  word wVar22;
  void *pvVar23;
  uint *puVar24;
  Vec_Int_t *pVVar25;
  int i;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  Nf_Cut_t *pNVar29;
  int *piVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  uint uVar39;
  Gia_Man_t *p_01;
  int *piVar40;
  Nf_Cut_t *pNVar41;
  int i_1;
  long lVar42;
  int Count_1;
  int iVar43;
  Nf_Cut_t *pNVar44;
  ulong uVar45;
  float fVar46;
  float fVar47;
  int local_1980;
  ulong local_1958;
  word local_1950;
  word local_1948;
  word local_1940;
  Nf_Cut_t *pCutsR [32];
  Nf_Cut_t pCuts2 [32];
  Nf_Cut_t pCuts0 [32];
  Nf_Cut_t pCuts1 [32];
  Nf_Cut_t pCuts [32];
  
  pObj = Gia_ManObj(p->pGia,iObj);
  iVar12 = 0;
  fVar46 = Nf_ObjFlowRefs(p,iObj,0);
  fVar47 = Nf_ObjFlowRefs(p,iObj,1);
  uVar32 = p->pPars->nLutSize;
  uVar27 = (ulong)uVar32;
  nCutNum = p->pPars->nCutNum;
  iVar8 = Nf_ManPrepareCuts(pCuts0,p,iObj - (*(uint *)pObj & 0x1fffffff),1);
  iVar9 = Nf_ManPrepareCuts(pCuts1,p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),1);
  p_01 = p->pGia;
  piVar40 = p_01->pSibls;
  if (piVar40 != (int *)0x0) {
    iVar12 = piVar40[iObj];
  }
  uVar16 = *(ulong *)pObj;
  iVar10 = Gia_ObjIsBuf(pObj);
  if (iVar10 != 0) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x366,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
  }
  fVar46 = fVar46 + fVar47;
  uVar31 = (uint)(uVar16 >> 0x1d) & 1;
  uVar11 = (uint)(uVar16 >> 0x3d) & 1;
  uVar16 = 0;
  uVar28 = 0;
  if (0 < (int)nCutNum) {
    uVar28 = (ulong)nCutNum;
  }
  pNVar29 = pCuts;
  for (; uVar28 != uVar16; uVar16 = uVar16 + 1) {
    pCutsR[uVar16] = pNVar29;
    pNVar29 = pNVar29 + 1;
  }
  if (iVar12 == 0) {
    nCuts = 0;
  }
  else {
    pGVar17 = Gia_ManObj(p_01,piVar40[iObj]);
    uVar2 = *(undefined8 *)pGVar17;
    uVar3 = *(undefined8 *)pObj;
    pNVar29 = pCuts2;
    nCuts = 0;
    iVar12 = Nf_ManPrepareCuts(pNVar29,p,iVar12,0);
    for (; pNVar29 < pCuts2 + iVar12; pNVar29 = pNVar29 + 1) {
      pNVar41 = pCutsR[(int)nCuts];
      wVar20 = pNVar29->Sign;
      iVar33 = pNVar29->Delay;
      fVar47 = pNVar29->Flow;
      iVar10 = pNVar29->pLeaves[0];
      uVar5 = *(undefined8 *)(pNVar29->pLeaves + 1);
      uVar6 = *(undefined8 *)(pNVar29->pLeaves + 3);
      uVar7 = *(undefined8 *)(pNVar29->pLeaves + 5);
      *(undefined4 *)&pNVar41->field_0x10 = *(undefined4 *)&pNVar29->field_0x10;
      pNVar41->pLeaves[0] = iVar10;
      *(undefined8 *)(pNVar41->pLeaves + 1) = uVar5;
      *(undefined8 *)(pNVar41->pLeaves + 3) = uVar6;
      *(undefined8 *)(pNVar41->pLeaves + 5) = uVar7;
      pNVar41->Sign = wVar20;
      pNVar41->Delay = iVar33;
      pNVar41->Flow = fVar47;
      *(uint *)&pNVar41->field_0x10 =
           *(uint *)&pNVar41->field_0x10 & 0xfc000000 |
           *(uint *)&pNVar41->field_0x10 & 0x3ffffff ^
           ((uint)((ulong)uVar2 >> 0x20) ^ (uint)((ulong)uVar3 >> 0x20)) >> 0x1f;
      Nf_CutParams(p,pNVar41,fVar46);
      nCuts = Nf_SetAddCut(pCutsR,nCuts,nCutNum);
    }
    p_01 = p->pGia;
  }
  if ((p_01->pMuxes == (uint *)0x0) || (uVar39 = p_01->pMuxes[iObj], uVar39 == 0)) {
    uVar2 = *(undefined8 *)pObj;
    uVar39 = (uint)uVar2;
    p->CutCount[0] = (double)(iVar9 * iVar8) + p->CutCount[0];
    piVar40 = pCuts0[0].pLeaves;
    for (pNVar29 = pCuts0; pNVar29 < pCuts0 + iVar8; pNVar29 = pNVar29 + 1) {
      for (pNVar41 = pCuts1; pNVar41 < pCuts1 + iVar9; pNVar41 = pNVar41 + 1) {
        uVar14 = *(uint *)&pNVar29->field_0x10;
        uVar13 = uVar14 >> 0x1b;
        uVar15 = *(uint *)&pNVar41->field_0x10;
        uVar26 = uVar15 >> 0x1b;
        if (((int)uVar32 < (int)(uVar26 + uVar13)) &&
           (uVar16 = pNVar41->Sign | pNVar29->Sign,
           uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555),
           uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
           (int)uVar32 <
           (int)(uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38))) goto LAB_00603b5b;
        p->CutCount[1] = p->CutCount[1] + 1.0;
        pNVar44 = pCutsR[(int)nCuts];
        pCut = pNVar44->pLeaves;
        if ((uVar13 == uVar32) && (uVar26 == uVar32)) {
          for (uVar16 = 0; uVar34 = uVar32, uVar27 != uVar16; uVar16 = uVar16 + 1) {
            if (piVar40[uVar16] != pNVar41->pLeaves[uVar16]) goto LAB_00603b5b;
            pCut[uVar16] = piVar40[uVar16];
          }
LAB_00603b1a:
          *(uint *)&pNVar44->field_0x10 =
               (*(uint *)&pNVar44->field_0x10 & 0x4000000) + uVar34 * 0x8000000 + 0x3ffffff;
          pNVar44->Sign = pNVar41->Sign | pNVar29->Sign;
          iVar12 = Nf_SetLastCutIsContained(pCutsR,nCuts);
          if (iVar12 == 0) {
            p->CutCount[2] = p->CutCount[2] + 1.0;
            uVar14 = *(uint *)&pNVar44->field_0x10;
            pVVar4 = p->vTtMem;
            iVar12 = Abc_Lit2Var(*(uint *)&pNVar29->field_0x10 & 0x3ffffff);
            pwVar19 = Vec_MemReadEntry(pVVar4,iVar12);
            uVar16 = *pwVar19;
            pVVar4 = p->vTtMem;
            iVar12 = Abc_Lit2Var(*(uint *)&pNVar41->field_0x10 & 0x3ffffff);
            pwVar19 = Vec_MemReadEntry(pVVar4,iVar12);
            uVar28 = *pwVar19;
            uVar15 = Abc_LitIsCompl(*(uint *)&pNVar29->field_0x10 & 0x3ffffff);
            uVar13 = Abc_LitIsCompl(*(uint *)&pNVar41->field_0x10 & 0x3ffffff);
            wVar20 = Abc_Tt6Expand(-(ulong)(uVar15 != uVar31) ^ uVar16,pNVar29->pLeaves,
                                   *(uint *)&pNVar29->field_0x10 >> 0x1b,pCut,
                                   *(uint *)&pNVar44->field_0x10 >> 0x1b);
            wVar21 = Abc_Tt6Expand(-(ulong)(uVar13 != uVar11) ^ uVar28,pNVar41->pLeaves,
                                   *(uint *)&pNVar41->field_0x10 >> 0x1b,pCut,
                                   *(uint *)&pNVar44->field_0x10 >> 0x1b);
            uVar16 = wVar21 & wVar20;
            if (((~uVar39 & 0x1fffffff) != 0 && -1 < (int)uVar39) &&
                (uVar39 & 0x1fffffff) < ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)) {
              uVar16 = wVar21 ^ wVar20;
            }
            pCuts2[0].Sign = -(ulong)((uint)uVar16 & 1) ^ uVar16;
            iVar12 = Abc_Tt6MinBase(&pCuts2[0].Sign,pCut,*(uint *)&pNVar44->field_0x10 >> 0x1b);
            *(uint *)&pNVar44->field_0x10 =
                 *(uint *)&pNVar44->field_0x10 & 0x7ffffff | iVar12 << 0x1b;
            if ((pCuts2[0].Sign & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                            ,0x1c9,
                            "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                           );
            }
            uVar14 = uVar14 >> 0x1b;
            iVar12 = Vec_MemHashInsert(p->vTtMem,&pCuts2[0].Sign);
            uVar13 = Abc_Var2Lit(iVar12,(uint)uVar16 & 1);
            uVar15 = *(uint *)&pNVar44->field_0x10;
            *(uint *)&pNVar44->field_0x10 = uVar15 & 0xfc000000 | uVar13 & 0x3ffffff;
            *(uint *)&pNVar44->field_0x10 =
                 uVar15 & 0xf8000000 | uVar13 & 0x3ffffff |
                 (uint)(p->vTt2Match->nSize <= iVar12) << 0x1a;
            uVar15 = uVar15 >> 0x1b;
            if (uVar14 < uVar15) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                            ,0x1cd,
                            "int Nf_CutComputeTruth6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, Nf_Cut_t *, int)"
                           );
            }
            if (uVar15 < uVar14) {
              wVar20 = Nf_CutGetSign(pCut,uVar15);
              pNVar44->Sign = wVar20;
            }
            Nf_CutParams(p,pNVar44,fVar46);
            nCuts = Nf_SetAddCut(pCutsR,nCuts,nCutNum);
          }
        }
        else {
          iVar12 = 0;
          uVar34 = 0;
          if (uVar14 < 0x8000000) {
LAB_00603ae9:
            if ((int)(uVar34 + uVar26) <= (int)(iVar12 + uVar32)) {
              piVar30 = pNVar44->pLeaves + (int)uVar34;
              for (lVar18 = (long)iVar12; lVar18 < (long)(ulong)uVar26; lVar18 = lVar18 + 1) {
                *piVar30 = pNVar41->pLeaves[lVar18];
                uVar34 = uVar34 + 1;
                piVar30 = piVar30 + 1;
              }
              goto LAB_00603b1a;
            }
          }
          else {
            iVar10 = 0;
            uVar34 = 0;
            if (0x7ffffff < uVar15) {
              iVar12 = 0;
              uVar16 = 0;
              lVar18 = 0;
              do {
                while( true ) {
                  iVar10 = (int)uVar16;
                  lVar42 = 0;
                  while( true ) {
                    if (uVar27 - lVar18 == lVar42) goto LAB_00603b5b;
                    iVar33 = piVar40[iVar10 + lVar42];
                    iVar38 = pNVar41->pLeaves[iVar12];
                    iVar36 = (int)lVar42;
                    iVar35 = (int)lVar18;
                    if (iVar38 <= iVar33) break;
                    pCut[lVar18 + lVar42] = iVar33;
                    lVar42 = lVar42 + 1;
                    if ((int)uVar13 <= (int)lVar42 + iVar10) goto LAB_00603e93;
                  }
                  lVar1 = lVar18 + 1 + lVar42;
                  if (iVar33 <= iVar38) break;
                  iVar12 = iVar12 + 1;
                  pCut[lVar18 + lVar42] = iVar38;
                  if ((int)uVar26 <= iVar12) {
                    iVar10 = iVar10 + iVar36;
                    goto LAB_00603eb5;
                  }
                  uVar16 = (ulong)(uint)(iVar10 + iVar36);
                  lVar18 = lVar1;
                }
                uVar16 = (uVar16 & 0xffffffff) + lVar42 + 1;
                pCut[lVar18 + lVar42] = iVar33;
                iVar12 = iVar12 + 1;
                if ((int)uVar13 <= (int)uVar16) {
LAB_00603e93:
                  uVar34 = iVar35 + iVar36 + 1;
                  goto LAB_00603ae9;
                }
                lVar18 = lVar1;
              } while (iVar12 < (int)uVar26);
              iVar10 = iVar10 + iVar36 + 1;
LAB_00603eb5:
              uVar34 = iVar35 + iVar36 + 1;
            }
            if ((int)(uVar34 + uVar13) <= (int)(iVar10 + uVar32)) {
              piVar30 = pNVar44->pLeaves + (int)uVar34;
              for (lVar18 = (long)iVar10; lVar18 < (long)(ulong)uVar13; lVar18 = lVar18 + 1) {
                *piVar30 = piVar40[lVar18];
                uVar34 = uVar34 + 1;
                piVar30 = piVar30 + 1;
              }
              goto LAB_00603b1a;
            }
          }
        }
LAB_00603b5b:
      }
      piVar40 = piVar40 + 0xc;
    }
  }
  else {
    iVar12 = Abc_Lit2Var(uVar39);
    iVar12 = Nf_ManPrepareCuts(pCuts2,p,iVar12,1);
    puVar24 = p->pGia->pMuxes;
    if (puVar24 == (uint *)0x0) {
      local_1980 = 0;
    }
    else {
      iVar10 = Gia_ObjId(p->pGia,pObj);
      local_1980 = Abc_LitIsCompl(puVar24[iVar10]);
    }
    p->CutCount[0] = (double)(iVar12 * iVar9 * iVar8) + p->CutCount[0];
    for (pNVar29 = pCuts0; pNVar29 < pCuts0 + iVar8; pNVar29 = pNVar29 + 1) {
      for (pNVar41 = pCuts1; pNVar41 < pCuts1 + iVar9; pNVar41 = pNVar41 + 1) {
        for (pNVar44 = pCuts2; pNVar44 < pCuts2 + iVar12; pNVar44 = pNVar44 + 1) {
          uVar16 = pNVar41->Sign | pNVar29->Sign | pNVar44->Sign;
          uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
          uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
          if ((int)(uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) <= (int)uVar32) {
            p->CutCount[1] = p->CutCount[1] + 1.0;
            pCut_00 = pCutsR[(int)nCuts];
            uVar39 = *(uint *)&pNVar29->field_0x10;
            uVar14 = *(uint *)&pNVar41->field_0x10;
            uVar15 = *(uint *)&pNVar44->field_0x10;
            piVar40 = pCut_00->pLeaves;
            uVar16 = 0;
            iVar10 = -0x3ffffff;
            uVar28 = 0;
            uVar45 = 0;
            uVar37 = 0;
            while( true ) {
              iVar38 = 1000000000;
              iVar33 = 1000000000;
              if ((uint)uVar37 != uVar39 >> 0x1b) {
                iVar33 = pNVar29->pLeaves[uVar37];
              }
              if ((uint)uVar45 != uVar14 >> 0x1b) {
                iVar38 = pNVar41->pLeaves[uVar45];
              }
              iVar35 = 1000000000;
              if ((uint)uVar28 != uVar15 >> 0x1b) {
                iVar35 = pNVar44->pLeaves[uVar28];
              }
              iVar36 = iVar38;
              if (iVar33 < iVar38) {
                iVar36 = iVar33;
              }
              iVar43 = iVar35;
              if (iVar36 < iVar35) {
                iVar43 = iVar36;
              }
              if (iVar43 == 1000000000) break;
              if (uVar27 == uVar16) goto LAB_006043df;
              pCut_00->pLeaves[uVar16] = iVar43;
              uVar16 = uVar16 + 1;
              uVar37 = (ulong)((uint)uVar37 + (uint)(iVar33 == iVar43));
              uVar45 = (ulong)((uint)uVar45 + (uint)(iVar38 == iVar43));
              uVar28 = (ulong)((uint)uVar28 + (uint)(iVar35 <= iVar36));
              iVar10 = iVar10 + -0x8000000;
            }
            *(uint *)&pCut_00->field_0x10 = (*(uint *)&pCut_00->field_0x10 & 0x4000000) - iVar10;
            pCut_00->Sign = pNVar41->Sign | pNVar29->Sign | pNVar44->Sign;
            iVar10 = Nf_SetLastCutIsContained(pCutsR,nCuts);
            if (iVar10 == 0) {
              p->CutCount[2] = p->CutCount[2] + 1.0;
              uVar39 = *(uint *)&pCut_00->field_0x10;
              pVVar4 = p->vTtMem;
              iVar10 = Abc_Lit2Var(*(uint *)&pNVar29->field_0x10 & 0x3ffffff);
              pwVar19 = Vec_MemReadEntry(pVVar4,iVar10);
              local_1950 = *pwVar19;
              pVVar4 = p->vTtMem;
              iVar10 = Abc_Lit2Var(*(uint *)&pNVar41->field_0x10 & 0x3ffffff);
              pwVar19 = Vec_MemReadEntry(pVVar4,iVar10);
              local_1948 = *pwVar19;
              pVVar4 = p->vTtMem;
              iVar10 = Abc_Lit2Var(*(uint *)&pNVar44->field_0x10 & 0x3ffffff);
              pwVar19 = Vec_MemReadEntry(pVVar4,iVar10);
              local_1940 = *pwVar19;
              uVar14 = Abc_LitIsCompl(*(uint *)&pNVar29->field_0x10 & 0x3ffffff);
              uVar45 = -(ulong)(uVar14 != uVar31) ^ local_1950;
              uVar14 = Abc_LitIsCompl(*(uint *)&pNVar41->field_0x10 & 0x3ffffff);
              uVar28 = -(ulong)(uVar14 != uVar11) ^ local_1948;
              iVar10 = Abc_LitIsCompl(*(uint *)&pNVar44->field_0x10 & 0x3ffffff);
              uVar16 = -(ulong)(iVar10 != local_1980) ^ local_1940;
              wVar20 = Abc_Tt6Expand(uVar45,pNVar29->pLeaves,*(uint *)&pNVar29->field_0x10 >> 0x1b,
                                     piVar40,*(uint *)&pCut_00->field_0x10 >> 0x1b);
              wVar21 = Abc_Tt6Expand(uVar28,pNVar41->pLeaves,*(uint *)&pNVar41->field_0x10 >> 0x1b,
                                     piVar40,*(uint *)&pCut_00->field_0x10 >> 0x1b);
              wVar22 = Abc_Tt6Expand(uVar16,pNVar44->pLeaves,*(uint *)&pNVar44->field_0x10 >> 0x1b,
                                     piVar40,*(uint *)&pCut_00->field_0x10 >> 0x1b);
              local_1958 = (wVar21 ^ wVar20) & wVar22 ^ wVar20;
              uVar14 = (uint)local_1958;
              local_1958 = -(ulong)(uVar14 & 1) ^ local_1958;
              iVar10 = Abc_Tt6MinBase(&local_1958,piVar40,*(uint *)&pCut_00->field_0x10 >> 0x1b);
              *(uint *)&pCut_00->field_0x10 =
                   *(uint *)&pCut_00->field_0x10 & 0x7ffffff | iVar10 << 0x1b;
              if ((local_1958 & 1) != 0) {
                __assert_fail("(int)(t & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x1df,
                              "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                             );
              }
              uVar39 = uVar39 >> 0x1b;
              iVar10 = Vec_MemHashInsert(p->vTtMem,&local_1958);
              uVar15 = Abc_Var2Lit(iVar10,uVar14 & 1);
              uVar14 = *(uint *)&pCut_00->field_0x10;
              *(uint *)&pCut_00->field_0x10 = uVar14 & 0xfc000000 | uVar15 & 0x3ffffff;
              *(uint *)&pCut_00->field_0x10 =
                   uVar14 & 0xf8000000 | uVar15 & 0x3ffffff |
                   (uint)(p->vTt2Match->nSize <= iVar10) << 0x1a;
              uVar14 = uVar14 >> 0x1b;
              if (uVar39 < uVar14) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x1e3,
                              "int Nf_CutComputeTruthMux6(Nf_Man_t *, Nf_Cut_t *, Nf_Cut_t *, Nf_Cut_t *, int, int, int, Nf_Cut_t *)"
                             );
              }
              if (uVar14 < uVar39) {
                wVar20 = Nf_CutGetSign(piVar40,uVar14);
                pCut_00->Sign = wVar20;
              }
              Nf_CutParams(p,pCut_00,fVar46);
              nCuts = Nf_SetAddCut(pCutsR,nCuts,nCutNum);
            }
          }
LAB_006043df:
        }
      }
    }
  }
  if ((0 < (int)nCuts) && ((int)nCuts < (int)nCutNum)) {
    Vec_FltWriteEntry(&p->vCutFlows,iObj,pCutsR[0]->Flow);
    Vec_IntWriteEntry(&p->vCutDelays,iObj,pCutsR[0]->Delay);
    uVar27 = (ulong)nCuts;
    iVar12 = 1;
    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
      iVar12 = iVar12 + (*(uint *)&pCutsR[uVar16]->field_0x10 >> 0x1b) + 1;
    }
    uVar32 = p->iCur;
    if (0xffff < (uVar32 & 0xffff) + iVar12) {
      uVar32 = (uVar32 & 0xffff0000) + 0x10000;
      p->iCur = uVar32;
    }
    iVar8 = (p->vPages).nSize;
    if (iVar8 == (int)uVar32 >> 0x10) {
      pvVar23 = malloc(0x40000);
      if (iVar8 == (p->vPages).nCap) {
        iVar9 = 0x10;
        if (0xf < iVar8) {
          iVar9 = iVar8 * 2;
        }
        Vec_PtrGrow(&p->vPages,iVar9);
        iVar8 = (p->vPages).nSize;
        uVar32 = p->iCur;
      }
      (p->vPages).nSize = iVar8 + 1;
      (p->vPages).pArray[iVar8] = pvVar23;
    }
    p->iCur = iVar12 + uVar32;
    puVar24 = (uint *)Nf_ManCutSet(p,uVar32);
    *puVar24 = nCuts;
    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
      pNVar29 = pCutsR[uVar16];
      puVar24[1] = (*(uint *)&pNVar29->field_0x10 & 0x3ffffff) << 5 |
                   *(uint *)&pNVar29->field_0x10 >> 0x1b;
      memcpy(puVar24 + 2,pNVar29->pLeaves,
             (ulong)(*(uint *)&pNVar29->field_0x10 >> 0x19 & 0xfffffffc));
      puVar24 = puVar24 + 1 + (*(uint *)&pNVar29->field_0x10 >> 0x1b);
    }
    puVar24 = (uint *)Vec_IntEntryP(&p->vCutSets,iObj);
    *puVar24 = uVar32;
    p->CutCount[3] = (double)(int)nCuts + p->CutCount[3];
    uVar32 = 0;
    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
      uVar32 = uVar32 + ((pCutsR[uVar16]->field_0x13 & 4) == 0);
    }
    p->CutCount[4] = (double)(int)uVar32 + p->CutCount[4];
    p->nCutUseAll = p->nCutUseAll + (uint)(uVar32 == nCuts);
    iVar12 = 0;
    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
      if ((*(uint *)&pCutsR[uVar16]->field_0x10 >> 0x1a & 1) == 0) {
        p_00 = p->vTt2Match;
        iVar8 = Abc_Lit2Var(*(uint *)&pCutsR[uVar16]->field_0x10 & 0x3ffffff);
        pVVar25 = Vec_WecEntry(p_00,iVar8);
        iVar12 = iVar12 + pVVar25->nSize / 2;
      }
    }
    p->CutCount[5] = (double)iVar12 + p->CutCount[5];
    return;
  }
  __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x3b1,"void Nf_ObjMergeOrder(Nf_Man_t *, int)");
}

Assistant:

void Nf_ObjMergeOrder( Nf_Man_t * p, int iObj )
{
    Nf_Cut_t pCuts0[NF_CUT_MAX], pCuts1[NF_CUT_MAX], pCuts[NF_CUT_MAX], * pCutsR[NF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    //Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    float dFlowRefs  = Nf_ObjFlowRefs(p, iObj, 0) + Nf_ObjFlowRefs(p, iObj, 1);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Nf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Nf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Nf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsUse, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Nf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Nf_Cut_t pCuts2[NF_CUT_MAX];
        int nCuts2  = Nf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Nf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Nf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Nf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Nf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Nf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( Nf_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Nf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Nf_CutParams( p, pCutsR[nCutsR], dFlowRefs );
            nCutsR = Nf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 10000 == 0 )
//    if ( iObj == 1090 )
    {
        printf( "*** Obj = %d  Useful = %d\n", iObj, Nf_ManCountUseful(pCutsR, nCutsR) );
        for ( i = 0; i < nCutsR; i++ )
            Nf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Nf_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Nf_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Nf_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Nf_ManSaveCuts(p, pCutsR, nCutsR, 0);
    p->CutCount[3] += nCutsR;
    nCutsUse = Nf_ManCountUseful(pCutsR, nCutsR);
    p->CutCount[4] += nCutsUse;
    p->nCutUseAll  += nCutsUse == nCutsR;
    p->CutCount[5] += Nf_ManCountMatches(p, pCutsR, nCutsR);
}